

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 (*pauVar9) [16];
  int iVar10;
  undefined4 uVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar17;
  Scene *pSVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  vint4 bi;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1300 [16];
  Scene *local_12e8;
  undefined1 local_12e0 [16];
  Geometry *local_12d0;
  ulong local_12c8;
  long local_12c0;
  long local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  RTCFilterFunctionNArguments local_12a0;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [16];
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar16;
  undefined1 auVar37 [32];
  undefined1 auVar40 [32];
  
  pauVar12 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar72 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11d0._4_4_ = fVar48;
  local_11d0._0_4_ = fVar48;
  local_11d0._8_4_ = fVar48;
  local_11d0._12_4_ = fVar48;
  auVar47 = ZEXT1664(local_11d0);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_11e0._4_4_ = fVar49;
  local_11e0._0_4_ = fVar49;
  local_11e0._8_4_ = fVar49;
  local_11e0._12_4_ = fVar49;
  auVar52 = ZEXT1664(local_11e0);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar49 = fVar49 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_12b0 = uVar20 ^ 0x10;
  uVar23 = local_12a8 ^ 0x10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar27 = ZEXT1664(CONCAT412(iVar10,CONCAT48(iVar10,CONCAT44(iVar10,iVar10))));
  local_11c0._8_4_ = 0x80000000;
  local_11c0._0_8_ = 0x8000000080000000;
  local_11c0._12_4_ = 0x80000000;
  local_11f0._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_11f0._8_4_ = -fVar44;
  local_11f0._12_4_ = -fVar44;
  auVar54 = ZEXT1664(local_11f0);
  local_1200._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_1200._8_4_ = -fVar48;
  local_1200._12_4_ = -fVar48;
  auVar59 = ZEXT1664(local_1200);
  local_1210._0_8_ = CONCAT44(fVar49,fVar49) ^ 0x8000000080000000;
  local_1210._8_4_ = -fVar49;
  local_1210._12_4_ = -fVar49;
  auVar62 = ZEXT1664(local_1210);
  iVar10 = (tray->tnear).field_0.i[k];
  local_1220._4_4_ = iVar10;
  local_1220._0_4_ = iVar10;
  local_1220._8_4_ = iVar10;
  local_1220._12_4_ = iVar10;
  auVar65 = ZEXT1664(local_1220);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar33._4_4_ = iVar10;
  auVar33._0_4_ = iVar10;
  auVar33._8_4_ = iVar10;
  auVar33._12_4_ = iVar10;
  auVar33._16_4_ = iVar10;
  auVar33._20_4_ = iVar10;
  auVar33._24_4_ = iVar10;
  auVar33._28_4_ = iVar10;
  auVar37 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar33 = vpand_avx2(auVar33,auVar37);
  local_10e0 = vpcmpeqd_avx2(auVar33,auVar37);
LAB_0055c0e2:
  do {
    pauVar9 = pauVar12 + -1;
    pauVar12 = pauVar12 + -1;
    if (*(float *)(*pauVar9 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar17 = *(ulong *)*pauVar12;
      while ((uVar17 & 8) == 0) {
        auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar20),auVar54._0_16_,
                                  auVar72._0_16_);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + local_12a8),auVar59._0_16_,
                                  auVar47._0_16_);
        auVar28 = vpmaxsd_avx(auVar28,auVar34);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar22),auVar62._0_16_,
                                  auVar52._0_16_);
        auVar34 = vpmaxsd_avx(auVar34,auVar65._0_16_);
        local_10c0 = vpmaxsd_avx(auVar28,auVar34);
        auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + local_12b0),auVar54._0_16_,
                                  auVar72._0_16_);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar23),auVar59._0_16_,
                                  auVar47._0_16_);
        auVar28 = vpminsd_avx(auVar28,auVar34);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar22 ^ 0x10)),
                                  auVar62._0_16_,auVar52._0_16_);
        auVar34 = vpminsd_avx(auVar34,auVar27._0_16_);
        auVar28 = vpminsd_avx(auVar28,auVar34);
        auVar28 = vpcmpgtd_avx(local_10c0,auVar28);
        iVar10 = vmovmskps_avx(auVar28);
        if (iVar10 == 0xf) {
          if (pauVar12 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0055c0e2;
        }
        bVar14 = (byte)iVar10 ^ 0xf;
        uVar21 = uVar17 & 0xfffffffffffffff0;
        lVar13 = 0;
        for (uVar17 = (ulong)bVar14; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar17 = *(ulong *)(uVar21 + lVar13 * 8);
        uVar15 = bVar14 - 1 & (uint)bVar14;
        uVar16 = (ulong)uVar15;
        if (uVar15 != 0) {
          uVar55 = *(uint *)((RTCHitN *)local_10c0 + lVar13 * 4);
          lVar13 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar19 = (ulong)uVar15;
          uVar16 = *(ulong *)(uVar21 + lVar13 * 8);
          uVar56 = *(uint *)((RTCHitN *)local_10c0 + lVar13 * 4);
          if (uVar15 == 0) {
            if (uVar55 < uVar56) {
              *(ulong *)*pauVar12 = uVar16;
              *(uint *)(*pauVar12 + 8) = uVar56;
              pauVar12 = pauVar12 + 1;
            }
            else {
              *(ulong *)*pauVar12 = uVar17;
              *(uint *)(*pauVar12 + 8) = uVar55;
              pauVar12 = pauVar12 + 1;
              uVar17 = uVar16;
            }
          }
          else {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar17;
            auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar55));
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar16;
            auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar56));
            lVar13 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar17 = (ulong)uVar15;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)(uVar21 + lVar13 * 8);
            auVar46 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar13 * 4))
                                     );
            auVar38 = vpcmpgtd_avx(auVar34,auVar28);
            if (uVar15 == 0) {
              auVar41 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar34,auVar28,auVar41);
              auVar28 = vblendvps_avx(auVar28,auVar34,auVar41);
              auVar34 = vpcmpgtd_avx(auVar46,auVar38);
              auVar41 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar46,auVar38,auVar41);
              auVar38 = vblendvps_avx(auVar38,auVar46,auVar41);
              auVar46 = vpcmpgtd_avx(auVar38,auVar28);
              auVar41 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar38,auVar28,auVar41);
              auVar28 = vblendvps_avx(auVar28,auVar38,auVar41);
              *pauVar12 = auVar28;
              pauVar12[1] = auVar46;
              uVar17 = auVar34._0_8_;
              pauVar12 = pauVar12 + 2;
            }
            else {
              lVar13 = 0;
              for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(uVar21 + lVar13 * 8);
              auVar53 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar13 * 4
                                                                 )));
              auVar41 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar34,auVar28,auVar41);
              auVar28 = vblendvps_avx(auVar28,auVar34,auVar41);
              auVar34 = vpcmpgtd_avx(auVar53,auVar46);
              auVar41 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar53,auVar46,auVar41);
              auVar46 = vblendvps_avx(auVar46,auVar53,auVar41);
              auVar41 = vpcmpgtd_avx(auVar46,auVar28);
              auVar53 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar46,auVar28,auVar53);
              auVar28 = vblendvps_avx(auVar28,auVar46,auVar53);
              auVar46 = vpcmpgtd_avx(auVar34,auVar38);
              auVar53 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar34,auVar38,auVar53);
              auVar34 = vblendvps_avx(auVar38,auVar34,auVar53);
              auVar38 = vpcmpgtd_avx(auVar41,auVar34);
              auVar53 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar41,auVar34,auVar53);
              auVar34 = vblendvps_avx(auVar34,auVar41,auVar53);
              *pauVar12 = auVar28;
              pauVar12[1] = auVar34;
              pauVar12[2] = auVar38;
              uVar17 = auVar46._0_8_;
              pauVar12 = pauVar12 + 3;
            }
          }
        }
      }
      local_12b8 = (ulong)((uint)uVar17 & 0xf) - 8;
      if (local_12b8 != 0) {
        uVar17 = uVar17 & 0xfffffffffffffff0;
        local_12c0 = 0;
        do {
          lVar13 = local_12c0 * 0x50;
          pSVar18 = context->scene;
          ppfVar2 = (pSVar18->vertices).items;
          pfVar3 = ppfVar2[*(uint *)(uVar17 + 0x30 + lVar13)];
          pfVar4 = ppfVar2[*(uint *)(uVar17 + 0x34 + lVar13)];
          pfVar5 = ppfVar2[*(uint *)(uVar17 + 0x38 + lVar13)];
          pfVar6 = ppfVar2[*(uint *)(uVar17 + 0x3c + lVar13)];
          auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + lVar13)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar17 + 8 + lVar13)));
          auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + lVar13)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar17 + 8 + lVar13)));
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 4 + lVar13)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar17 + 0xc + lVar13)))
          ;
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 4 + lVar13)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar17 + 0xc + lVar13)))
          ;
          auVar30 = vunpcklps_avx(auVar28,auVar34);
          auVar35 = vunpcklps_avx(auVar38,auVar46);
          auVar43 = vunpckhps_avx(auVar38,auVar46);
          auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + 0x10 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar17 + 0x18 + lVar13)));
          auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + 0x10 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar17 + 0x18 + lVar13)));
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 0x14 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar17 + 0x1c + lVar13)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 0x14 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar17 + 0x1c + lVar13)));
          auVar53 = vunpcklps_avx(auVar28,auVar34);
          auVar24 = vunpcklps_avx(auVar38,auVar46);
          auVar28 = vunpckhps_avx(auVar38,auVar46);
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + 0x20 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar17 + 0x28 + lVar13)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar17 + 0x20 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar17 + 0x28 + lVar13)));
          auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 0x24 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar17 + 0x2c + lVar13)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar17 + 0x24 + lVar13))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar17 + 0x2c + lVar13)));
          auVar29 = vunpcklps_avx(auVar34,auVar38);
          auVar45 = vunpcklps_avx(auVar46,auVar41);
          auVar41 = vunpckhps_avx(auVar46,auVar41);
          puVar1 = (undefined8 *)(uVar17 + 0x30 + lVar13);
          local_11b0 = *puVar1;
          uStack_11a8 = puVar1[1];
          puVar1 = (undefined8 *)(uVar17 + 0x40 + lVar13);
          local_1270 = *puVar1;
          uStack_1268 = puVar1[1];
          auVar34 = vsubps_avx(auVar35,auVar24);
          auVar28 = vsubps_avx(auVar43,auVar28);
          auVar38 = vsubps_avx(auVar30,auVar53);
          auVar46 = vsubps_avx(auVar45,auVar35);
          auVar41 = vsubps_avx(auVar41,auVar43);
          auVar53 = vsubps_avx(auVar29,auVar30);
          auVar24._0_4_ = auVar53._0_4_ * auVar28._0_4_;
          auVar24._4_4_ = auVar53._4_4_ * auVar28._4_4_;
          auVar24._8_4_ = auVar53._8_4_ * auVar28._8_4_;
          auVar24._12_4_ = auVar53._12_4_ * auVar28._12_4_;
          local_1110 = vfmsub231ps_fma(auVar24,auVar41,auVar38);
          auVar29._0_4_ = auVar38._0_4_ * auVar46._0_4_;
          auVar29._4_4_ = auVar38._4_4_ * auVar46._4_4_;
          auVar29._8_4_ = auVar38._8_4_ * auVar46._8_4_;
          auVar29._12_4_ = auVar38._12_4_ * auVar46._12_4_;
          local_1100 = vfmsub231ps_fma(auVar29,auVar53,auVar34);
          uVar11 = *(undefined4 *)(ray + k * 4);
          auVar63._4_4_ = uVar11;
          auVar63._0_4_ = uVar11;
          auVar63._8_4_ = uVar11;
          auVar63._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar66._4_4_ = uVar11;
          auVar66._0_4_ = uVar11;
          auVar66._8_4_ = uVar11;
          auVar66._12_4_ = uVar11;
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar69._4_4_ = uVar11;
          auVar69._0_4_ = uVar11;
          auVar69._8_4_ = uVar11;
          auVar69._12_4_ = uVar11;
          fVar44 = *(float *)(ray + k * 4 + 0x80);
          auVar58._4_4_ = fVar44;
          auVar58._0_4_ = fVar44;
          auVar58._8_4_ = fVar44;
          auVar58._12_4_ = fVar44;
          auVar35 = vsubps_avx(auVar35,auVar63);
          fVar48 = *(float *)(ray + k * 4 + 0xa0);
          auVar64._4_4_ = fVar48;
          auVar64._0_4_ = fVar48;
          auVar64._8_4_ = fVar48;
          auVar64._12_4_ = fVar48;
          auVar43 = vsubps_avx(auVar43,auVar66);
          fVar49 = *(float *)(ray + k * 4 + 0xc0);
          auVar67._4_4_ = fVar49;
          auVar67._0_4_ = fVar49;
          auVar67._8_4_ = fVar49;
          auVar67._12_4_ = fVar49;
          auVar30 = vsubps_avx(auVar30,auVar69);
          auVar70._0_4_ = fVar44 * auVar43._0_4_;
          auVar70._4_4_ = fVar44 * auVar43._4_4_;
          auVar70._8_4_ = fVar44 * auVar43._8_4_;
          auVar70._12_4_ = fVar44 * auVar43._12_4_;
          auVar24 = vfmsub231ps_fma(auVar70,auVar35,auVar64);
          auVar60._0_4_ = auVar53._0_4_ * auVar24._0_4_;
          auVar60._4_4_ = auVar53._4_4_ * auVar24._4_4_;
          auVar60._8_4_ = auVar53._8_4_ * auVar24._8_4_;
          auVar60._12_4_ = auVar53._12_4_ * auVar24._12_4_;
          auVar71._0_4_ = auVar38._0_4_ * auVar24._0_4_;
          auVar71._4_4_ = auVar38._4_4_ * auVar24._4_4_;
          auVar71._8_4_ = auVar38._8_4_ * auVar24._8_4_;
          auVar71._12_4_ = auVar38._12_4_ * auVar24._12_4_;
          auVar53._0_4_ = fVar49 * auVar35._0_4_;
          auVar53._4_4_ = fVar49 * auVar35._4_4_;
          auVar53._8_4_ = fVar49 * auVar35._8_4_;
          auVar53._12_4_ = fVar49 * auVar35._12_4_;
          auVar53 = vfmsub231ps_fma(auVar53,auVar30,auVar58);
          auVar38 = vfmadd231ps_fma(auVar60,auVar53,auVar41);
          auVar53 = vfmadd231ps_fma(auVar71,auVar28,auVar53);
          auVar51._0_4_ = auVar41._0_4_ * auVar34._0_4_;
          auVar51._4_4_ = auVar41._4_4_ * auVar34._4_4_;
          auVar51._8_4_ = auVar41._8_4_ * auVar34._8_4_;
          auVar51._12_4_ = auVar41._12_4_ * auVar34._12_4_;
          local_10f0 = vfmsub231ps_fma(auVar51,auVar46,auVar28);
          auVar45._0_4_ = fVar48 * auVar30._0_4_;
          auVar45._4_4_ = fVar48 * auVar30._4_4_;
          auVar45._8_4_ = fVar48 * auVar30._8_4_;
          auVar45._12_4_ = fVar48 * auVar30._12_4_;
          auVar24 = vfmsub231ps_fma(auVar45,auVar43,auVar67);
          auVar68._0_4_ = local_10f0._0_4_ * fVar49;
          auVar68._4_4_ = local_10f0._4_4_ * fVar49;
          auVar68._8_4_ = local_10f0._8_4_ * fVar49;
          auVar68._12_4_ = local_10f0._12_4_ * fVar49;
          auVar28 = vfmadd231ps_fma(auVar68,local_1100,auVar64);
          auVar41 = vfmadd231ps_fma(auVar28,local_1110,auVar58);
          auVar38 = vfmadd231ps_fma(auVar38,auVar24,auVar46);
          auVar28 = vandps_avx(auVar41,local_11c0);
          uVar15 = auVar28._0_4_;
          local_11a0._0_4_ = (float)(uVar15 ^ auVar38._0_4_);
          uVar55 = auVar28._4_4_;
          local_11a0._4_4_ = (float)(uVar55 ^ auVar38._4_4_);
          uVar56 = auVar28._8_4_;
          local_11a0._8_4_ = (float)(uVar56 ^ auVar38._8_4_);
          uVar57 = auVar28._12_4_;
          local_11a0._12_4_ = (float)(uVar57 ^ auVar38._12_4_);
          auVar28 = vfmadd231ps_fma(auVar53,auVar34,auVar24);
          local_1190._0_4_ = (float)(uVar15 ^ auVar28._0_4_);
          local_1190._4_4_ = (float)(uVar55 ^ auVar28._4_4_);
          local_1190._8_4_ = (float)(uVar56 ^ auVar28._8_4_);
          local_1190._12_4_ = (float)(uVar57 ^ auVar28._12_4_);
          auVar38 = ZEXT816(0) << 0x20;
          auVar28 = vcmpps_avx(local_11a0,auVar38,5);
          auVar34 = vcmpps_avx(local_1190,auVar38,5);
          auVar28 = vandps_avx(auVar34,auVar28);
          auVar46._8_4_ = 0x7fffffff;
          auVar46._0_8_ = 0x7fffffff7fffffff;
          auVar46._12_4_ = 0x7fffffff;
          local_1170 = vandps_avx(auVar41,auVar46);
          auVar34 = vcmpps_avx(auVar41,auVar38,4);
          auVar28 = vandps_avx(auVar28,auVar34);
          auVar61._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
          auVar61._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
          auVar61._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
          auVar61._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
          auVar34 = vcmpps_avx(auVar61,local_1170,2);
          auVar38 = auVar34 & auVar28;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar28 = vandps_avx(auVar28,auVar34);
            auVar42._0_4_ = local_10f0._0_4_ * auVar30._0_4_;
            auVar42._4_4_ = local_10f0._4_4_ * auVar30._4_4_;
            auVar42._8_4_ = local_10f0._8_4_ * auVar30._8_4_;
            auVar42._12_4_ = local_10f0._12_4_ * auVar30._12_4_;
            auVar34 = vfmadd213ps_fma(auVar43,local_1100,auVar42);
            auVar34 = vfmadd213ps_fma(auVar35,local_1110,auVar34);
            local_1180._0_4_ = (float)(uVar15 ^ auVar34._0_4_);
            local_1180._4_4_ = (float)(uVar55 ^ auVar34._4_4_);
            local_1180._8_4_ = (float)(uVar56 ^ auVar34._8_4_);
            local_1180._12_4_ = (float)(uVar57 ^ auVar34._12_4_);
            fVar44 = *(float *)(ray + k * 4 + 0x60);
            auVar35._0_4_ = local_1170._0_4_ * fVar44;
            auVar35._4_4_ = local_1170._4_4_ * fVar44;
            auVar35._8_4_ = local_1170._8_4_ * fVar44;
            auVar35._12_4_ = local_1170._12_4_ * fVar44;
            auVar34 = vcmpps_avx(auVar35,local_1180,1);
            fVar44 = *(float *)(ray + k * 4 + 0x100);
            auVar27 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
            auVar43._0_4_ = fVar44 * local_1170._0_4_;
            auVar43._4_4_ = fVar44 * local_1170._4_4_;
            auVar43._8_4_ = fVar44 * local_1170._8_4_;
            auVar43._12_4_ = fVar44 * local_1170._12_4_;
            auVar38 = vcmpps_avx(local_1180,auVar43,2);
            auVar34 = vandps_avx(auVar34,auVar38);
            auVar38 = auVar28 & auVar34;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              local_1300 = vandps_avx(auVar28,auVar34);
              local_1150 = local_1300;
              auVar28 = vrcpps_avx(local_1170);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = 0x3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar34 = vfnmadd213ps_fma(local_1170,auVar28,auVar30);
              auVar28 = vfmadd132ps_fma(auVar34,auVar28,auVar28);
              fVar44 = auVar28._0_4_;
              local_1120._0_4_ = fVar44 * local_1180._0_4_;
              fVar48 = auVar28._4_4_;
              local_1120._4_4_ = fVar48 * local_1180._4_4_;
              fVar49 = auVar28._8_4_;
              local_1120._8_4_ = fVar49 * local_1180._8_4_;
              fVar50 = auVar28._12_4_;
              local_1120._12_4_ = fVar50 * local_1180._12_4_;
              auVar47 = ZEXT1664(local_1120);
              local_1140[0] = fVar44 * local_11a0._0_4_;
              local_1140[1] = fVar48 * local_11a0._4_4_;
              local_1140[2] = fVar49 * local_11a0._8_4_;
              local_1140[3] = fVar50 * local_11a0._12_4_;
              auVar31._8_4_ = 0x7f800000;
              auVar31._0_8_ = 0x7f8000007f800000;
              auVar31._12_4_ = 0x7f800000;
              auVar28 = vblendvps_avx(auVar31,local_1120,local_1300);
              local_1130[0] = fVar44 * local_1190._0_4_;
              local_1130[1] = fVar48 * local_1190._4_4_;
              local_1130[2] = fVar49 * local_1190._8_4_;
              local_1130[3] = fVar50 * local_1190._12_4_;
              auVar34 = vshufps_avx(auVar28,auVar28,0xb1);
              auVar34 = vminps_avx(auVar34,auVar28);
              auVar38 = vshufpd_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar38,auVar34);
              auVar28 = vcmpps_avx(auVar28,auVar34,0);
              auVar38 = local_1300 & auVar28;
              auVar34 = vpcmpeqd_avx(auVar34,auVar34);
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                auVar34 = auVar28;
              }
              auVar28 = vandps_avx(local_1300,auVar34);
              uVar11 = vmovmskps_avx(auVar28);
              local_12c8 = 0;
              for (uVar21 = CONCAT44((int)((ulong)lVar13 >> 0x20),uVar11); local_12e8 = pSVar18,
                  (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                local_12c8 = local_12c8 + 1;
              }
              do {
                local_12e0 = auVar27._0_16_;
                uVar15 = *(uint *)((long)&local_11b0 + local_12c8 * 4);
                uVar21 = (ulong)uVar15;
                local_12d0 = (pSVar18->geometries).items[uVar21].ptr;
                if ((local_12d0->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1300 + local_12c8 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_12d0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar44 = local_1140[local_12c8];
                    fVar48 = local_1130[local_12c8];
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_1120 + local_12c8 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) =
                         *(undefined4 *)(local_1110 + local_12c8 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) =
                         *(undefined4 *)(local_1100 + local_12c8 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) =
                         *(undefined4 *)(local_10f0 + local_12c8 * 4);
                    *(float *)(ray + k * 4 + 0x1e0) = fVar44;
                    *(float *)(ray + k * 4 + 0x200) = fVar48;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1270 + local_12c8 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar15;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_1240 = auVar47._0_16_;
                  local_1230 = auVar72._0_16_;
                  fVar44 = local_1140[local_12c8];
                  local_1060._4_4_ = fVar44;
                  local_1060._0_4_ = fVar44;
                  local_1060._8_4_ = fVar44;
                  local_1060._12_4_ = fVar44;
                  local_1060._16_4_ = fVar44;
                  local_1060._20_4_ = fVar44;
                  local_1060._24_4_ = fVar44;
                  local_1060._28_4_ = fVar44;
                  local_1040 = local_1130[local_12c8];
                  uVar11 = *(undefined4 *)((long)&local_1270 + local_12c8 * 4);
                  auVar39._4_4_ = uVar11;
                  auVar39._0_4_ = uVar11;
                  auVar39._8_4_ = uVar11;
                  auVar39._12_4_ = uVar11;
                  auVar40._16_4_ = uVar11;
                  auVar40._0_16_ = auVar39;
                  auVar40._20_4_ = uVar11;
                  auVar40._24_4_ = uVar11;
                  auVar40._28_4_ = uVar11;
                  local_10c0._4_4_ = *(undefined4 *)(local_1110 + local_12c8 * 4);
                  uVar11 = *(undefined4 *)(local_1100 + local_12c8 * 4);
                  local_10a0._4_4_ = uVar11;
                  local_10a0._0_4_ = uVar11;
                  local_10a0._8_4_ = uVar11;
                  local_10a0._12_4_ = uVar11;
                  local_10a0._16_4_ = uVar11;
                  local_10a0._20_4_ = uVar11;
                  local_10a0._24_4_ = uVar11;
                  local_10a0._28_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_10f0 + local_12c8 * 4);
                  local_1080._4_4_ = uVar11;
                  local_1080._0_4_ = uVar11;
                  local_1080._8_4_ = uVar11;
                  local_1080._12_4_ = uVar11;
                  local_1080._16_4_ = uVar11;
                  local_1080._20_4_ = uVar11;
                  local_1080._24_4_ = uVar11;
                  local_1080._28_4_ = uVar11;
                  auVar36._4_4_ = uVar15;
                  auVar36._0_4_ = uVar15;
                  auVar36._8_4_ = uVar15;
                  auVar36._12_4_ = uVar15;
                  auVar37._16_4_ = uVar15;
                  auVar37._0_16_ = auVar36;
                  auVar37._20_4_ = uVar15;
                  auVar37._24_4_ = uVar15;
                  auVar37._28_4_ = uVar15;
                  local_10c0._0_4_ = local_10c0._4_4_;
                  local_10c0._8_4_ = local_10c0._4_4_;
                  local_10c0._12_4_ = local_10c0._4_4_;
                  uStack_10b0 = local_10c0._4_4_;
                  uStack_10ac = local_10c0._4_4_;
                  uStack_10a8 = local_10c0._4_4_;
                  uStack_10a4 = local_10c0._4_4_;
                  fStack_103c = local_1040;
                  fStack_1038 = local_1040;
                  fStack_1034 = local_1040;
                  fStack_1030 = local_1040;
                  fStack_102c = local_1040;
                  fStack_1028 = local_1040;
                  fStack_1024 = local_1040;
                  local_1020 = auVar40;
                  local_1000 = auVar37;
                  vpcmpeqd_avx2(local_1060,local_1060);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_1120 + local_12c8 * 4);
                  local_1260 = local_10e0;
                  local_12a0.valid = (int *)local_1260;
                  local_12a0.geometryUserPtr = local_12d0->userPtr;
                  local_12a0.context = context->user;
                  local_12a0.hit = (RTCHitN *)local_10c0;
                  local_12a0.N = 8;
                  local_12a0.ray = (RTCRayN *)ray;
                  if (local_12d0->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar37 = ZEXT1632(auVar36);
                    auVar40 = ZEXT1632(auVar39);
                    (*local_12d0->intersectionFilterN)(&local_12a0);
                  }
                  auVar26 = vpcmpeqd_avx2(local_1260,_DAT_01faff00);
                  auVar33 = _DAT_01fe9960 & ~auVar26;
                  if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar33 >> 0x7f,0) == '\0') &&
                        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar33 >> 0xbf,0) == '\0') &&
                      (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar33[0x1f]) {
                    auVar26 = auVar26 ^ _DAT_01fe9960;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_12d0->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar37 = ZEXT1632(auVar37._0_16_);
                      auVar40 = ZEXT1632(auVar40._0_16_);
                      (*p_Var7)(&local_12a0);
                    }
                    auVar8 = vpcmpeqd_avx2(local_1260,_DAT_01faff00);
                    auVar33 = vpcmpeqd_avx2(auVar40,auVar40);
                    auVar26 = auVar8 ^ auVar33;
                    auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                    auVar33 = auVar33 & ~auVar8;
                    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar33 >> 0x7f,0) != '\0') ||
                          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar33 >> 0xbf,0) != '\0') ||
                        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar33[0x1f] < '\0') {
                      auVar8 = auVar8 ^ auVar37;
                      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])local_12a0.hit);
                      *(undefined1 (*) [32])(local_12a0.ray + 0x180) = auVar33;
                      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1a0) = auVar33;
                      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1c0) = auVar33;
                      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1e0) = auVar33;
                      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_12a0.ray + 0x200) = auVar33;
                      auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x220) = auVar33;
                      auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x240) = auVar33;
                      auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x260) = auVar33;
                      auVar33 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])
                                                        (local_12a0.hit + 0x100));
                      *(undefined1 (*) [32])(local_12a0.ray + 0x280) = auVar33;
                    }
                  }
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar26 >> 0x7f,0) == '\0') &&
                        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0xbf,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar26[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_12e0._0_4_;
                  }
                  else {
                    local_12e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_1300 + local_12c8 * 4) = 0;
                  auVar27 = ZEXT1664(local_12e0);
                  uVar11 = local_12e0._0_4_;
                  auVar25._4_4_ = uVar11;
                  auVar25._0_4_ = uVar11;
                  auVar25._8_4_ = uVar11;
                  auVar25._12_4_ = uVar11;
                  auVar47 = ZEXT1664(local_1240);
                  auVar28 = vcmpps_avx(local_1240,auVar25,2);
                  local_1300 = vandps_avx(auVar28,local_1300);
                  auVar72 = ZEXT1664(local_1230);
                  uVar21 = local_12c8;
                  pSVar18 = local_12e8;
                }
                if ((((local_1300 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1300[0xf]) break;
                auVar32._8_4_ = 0x7f800000;
                auVar32._0_8_ = 0x7f8000007f800000;
                auVar32._12_4_ = 0x7f800000;
                auVar28 = vblendvps_avx(auVar32,auVar47._0_16_,local_1300);
                auVar34 = vshufps_avx(auVar28,auVar28,0xb1);
                auVar34 = vminps_avx(auVar34,auVar28);
                auVar38 = vshufpd_avx(auVar34,auVar34,1);
                auVar34 = vminps_avx(auVar38,auVar34);
                auVar34 = vcmpps_avx(auVar28,auVar34,0);
                auVar38 = local_1300 & auVar34;
                auVar28 = local_1300;
                if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar38[0xf] < '\0') {
                  auVar28 = vandps_avx(auVar34,local_1300);
                }
                uVar11 = vmovmskps_avx(auVar28);
                local_12c8 = 0;
                for (uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar11); (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  local_12c8 = local_12c8 + 1;
                }
              } while( true );
            }
          }
          local_12c0 = local_12c0 + 1;
        } while (local_12c0 != local_12b8);
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar27 = ZEXT1664(CONCAT412(uVar11,CONCAT48(uVar11,CONCAT44(uVar11,uVar11))));
      auVar47 = ZEXT1664(local_11d0);
      auVar52 = ZEXT1664(local_11e0);
      auVar54 = ZEXT1664(local_11f0);
      auVar59 = ZEXT1664(local_1200);
      auVar62 = ZEXT1664(local_1210);
      auVar65 = ZEXT1664(local_1220);
    }
    if (pauVar12 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }